

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O3

string * __thiscall
choc::text::replace<std::__cxx11::string,char_const(&)[3],char_const(&)[2]>
          (string *__return_storage_ptr__,text *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *textToSearch,
          string_view firstToReplace,string_view firstReplacement,
          char (*otherPairsOfStringsToReplace) [3],char (*otherPairsOfStringsToReplace_1) [2])

{
  text *ptVar1;
  string_view firstReplacement_00;
  string_view firstReplacement_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *textToSearch_00;
  char *pcVar2;
  string_view firstToReplace_00;
  text *ptVar3;
  char *pcVar4;
  long local_58;
  undefined8 uStack_50;
  string local_48;
  
  ptVar1 = this + 0x10;
  if (*(text **)this == ptVar1) {
    local_58 = *(long *)ptVar1;
    uStack_50 = *(undefined8 *)(this + 0x18);
    ptVar3 = (text *)&local_58;
  }
  else {
    local_58 = *(long *)ptVar1;
    ptVar3 = *(text **)this;
  }
  pcVar4 = *(char **)(this + 8);
  *(text **)this = ptVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (text)0x0;
  firstReplacement_00._M_str = pcVar4;
  firstReplacement_00._M_len = (size_t)ptVar3;
  replace<std::__cxx11::string>
            (&local_48,(text *)&stack0xffffffffffffff98,textToSearch,firstToReplace,
             firstReplacement_00);
  textToSearch_00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       strlen((char *)firstReplacement._M_len);
  pcVar2 = (char *)strlen(firstReplacement._M_str);
  firstReplacement_01._M_str = pcVar4;
  firstReplacement_01._M_len = (size_t)ptVar3;
  firstToReplace_00._M_str = pcVar2;
  firstToReplace_00._M_len = firstReplacement._M_len;
  replace<std::__cxx11::string>
            (__return_storage_ptr__,(text *)&local_48,textToSearch_00,firstToReplace_00,
             firstReplacement_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (ptVar3 != (text *)&local_58) {
    operator_delete(ptVar3,local_58 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string replace (StringType textToSearch, std::string_view firstToReplace, std::string_view firstReplacement,
                     OtherReplacements&&... otherPairsOfStringsToReplace)
{
    static_assert ((sizeof... (otherPairsOfStringsToReplace) & 1u) == 0,
                   "This function expects a list of pairs of strings as its arguments");

    if constexpr (std::is_same<const StringType, const std::string_view>::value || std::is_same<const StringType, const char* const>::value)
    {
        return replace (std::string (textToSearch), firstToReplace, firstReplacement,
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
    else if constexpr (sizeof... (otherPairsOfStringsToReplace) == 0)
    {
        size_t pos = 0;

        for (;;)
        {
            pos = textToSearch.find (firstToReplace, pos);

            if (pos == std::string::npos)
                return textToSearch;

            textToSearch.replace (pos, firstToReplace.length(), firstReplacement);
            pos += firstReplacement.length();
        }
    }
    else
    {
        return replace (replace (std::move (textToSearch), firstToReplace, firstReplacement),
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
}